

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *table)

{
  uint uVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ImGuiTableColumn *pIVar7;
  ImDrawChannel *pIVar8;
  ImDrawCmd *pIVar9;
  ImRect *pIVar10;
  long in_RDI;
  ImVec4 IVar11;
  ImDrawChannel *channel_1;
  int n_2;
  ImDrawChannel *channel;
  int n_1;
  int n;
  ImRect merge_clip_rect;
  MergeGroup *merge_group_1;
  int merge_channels_count;
  int merge_group_n;
  int remaining_count;
  ImBitArray<130> remaining_mask;
  ImDrawChannel *dst_tmp;
  bool may_extend_clip_rect_to_host_rect;
  MergeGroup *merge_group;
  int merge_group_dst_n;
  float width_contents;
  ImDrawChannel *src_channel;
  int channel_no;
  int merge_group_sub_n;
  int merge_group_sub_count;
  ImGuiTableColumn *column;
  int column_n;
  bool merge_groups_all_fit_within_inner_rect;
  MergeGroup merge_groups [4];
  int merge_group_mask;
  bool is_frozen_h;
  bool is_frozen_v;
  ImDrawListSplitter *splitter;
  ImGuiContext *g;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  float in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe14;
  undefined1 in_stack_fffffffffffffe15;
  undefined1 uVar12;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  undefined8 in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  int local_1cc;
  char local_1c1;
  ImRect *local_1b0;
  int local_19c;
  undefined8 local_198;
  undefined8 local_190;
  ImRect local_188;
  ImDrawChannel *local_178;
  int local_170;
  int local_16c;
  ImRect local_168;
  long local_158;
  float local_150;
  int local_14c;
  int local_148;
  ImBitArray<130> local_144;
  ImDrawChannel *local_130;
  byte local_121;
  ImRect local_120;
  ImVec2 local_110;
  ImVec2 local_108;
  ImRect *local_100;
  byte bVar13;
  int iVar14;
  int local_d0;
  ImRect local_c8;
  ImVec2 aIStack_b8 [18];
  ImRect IStack_28;
  long local_18;
  ImGuiContext *local_10;
  long local_8;
  
  local_10 = GImGui;
  local_18 = in_RDI + 0x180;
  IStack_28.Max.y._3_1_ = '\0' < *(char *)(in_RDI + 0x1ce);
  IStack_28.Max.y._2_1_ = '\0' < *(char *)(in_RDI + 0x1d0);
  IStack_28.Max.x = 0.0;
  local_1b0 = &local_c8;
  local_8 = in_RDI;
  do {
    TableReorderDrawChannelsForMerge::MergeGroup::MergeGroup
              ((MergeGroup *)
               CONCAT17(in_stack_fffffffffffffe17,
                        CONCAT16(in_stack_fffffffffffffe16,
                                 CONCAT15(in_stack_fffffffffffffe15,
                                          CONCAT14(in_stack_fffffffffffffe14,
                                                   in_stack_fffffffffffffe10)))));
    local_1b0 = (ImRect *)&local_1b0[2].Max;
  } while (local_1b0 != &IStack_28);
  memset(&local_c8,0,0xa0);
  uVar1 = *(uint *)(local_8 + 4);
  local_d0 = 0;
  do {
    if (*(int *)(local_8 + 0x6c) <= local_d0) {
      if (IStack_28.Max.x != 0.0) {
        local_121 = 0;
        if ((IStack_28.Max.x == 1.12104e-44) && (local_121 = 0, (IStack_28.Max.y._3_1_ & 1) == 0)) {
          local_121 = IStack_28.Max.y._2_1_ ^ 0xff;
        }
        local_121 = local_121 & 1;
        ImVector<ImDrawChannel>::resize
                  ((ImVector<ImDrawChannel> *)
                   CONCAT17(in_stack_fffffffffffffe17,
                            CONCAT16(in_stack_fffffffffffffe16,
                                     CONCAT15(in_stack_fffffffffffffe15,
                                              CONCAT14(in_stack_fffffffffffffe14,
                                                       in_stack_fffffffffffffe10)))),
                   in_stack_fffffffffffffe0c);
        local_130 = (local_10->DrawChannelsTempMergeBuffer).Data;
        ImBitArray<130>::ImBitArray(&local_144);
        ImBitArray<130>::ClearBits((ImBitArray<130> *)0x2d69e8);
        ImBitArray<130>::SetBitRange
                  ((ImBitArray<130> *)
                   CONCAT17(in_stack_fffffffffffffe17,
                            CONCAT16(in_stack_fffffffffffffe16,
                                     CONCAT15(in_stack_fffffffffffffe15,
                                              CONCAT14(in_stack_fffffffffffffe14,
                                                       in_stack_fffffffffffffe10)))),
                   in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
        local_148 = *(int *)(local_18 + 4) + -1;
        for (local_14c = 0; local_14c < 4; local_14c = local_14c + 1) {
          local_150 = aIStack_b8[(long)local_14c * 5].x;
          if (local_150 != 0.0) {
            local_158 = (long)&local_c8 + (long)local_14c * 0x28;
            local_168.Min = *(ImVec2 *)((long)&local_c8 + (long)local_14c * 0x28);
            local_168.Max = aIStack_b8[(long)local_14c * 5 + -1];
            if ((local_121 & 1) != 0) {
              if (local_14c != 3) {
                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                            ,0x2448,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                            "merge_group_n == 3");
              }
              if ((uVar1 & 0x40000) == 0) {
                pIVar10 = (ImRect *)(local_8 + 0x124);
              }
              else {
                pIVar10 = (ImRect *)(local_8 + 0x104);
              }
              ImRect::Add(&local_168,pIVar10);
            }
            local_148 = local_148 - *(int *)(local_158 + 0x10);
            for (local_16c = 0; local_16c < 5; local_16c = local_16c + 1) {
              local_144.Storage[local_16c] =
                   (*(uint *)(local_158 + (long)local_16c * 4 + 0x14) ^ 0xffffffff) &
                   local_144.Storage[local_16c];
            }
            for (local_170 = 0; bVar2 = local_170 < *(int *)(local_18 + 4),
                in_stack_fffffffffffffe17 = bVar2 && local_150 != 0.0, bVar2 && local_150 != 0.0;
                local_170 = local_170 + 1) {
              bVar2 = ImBitArray<130>::TestBit
                                ((ImBitArray<130> *)
                                 CONCAT17(in_stack_fffffffffffffe17,
                                          CONCAT16(in_stack_fffffffffffffe16,
                                                   CONCAT15(in_stack_fffffffffffffe15,
                                                            CONCAT14(in_stack_fffffffffffffe14,
                                                                     in_stack_fffffffffffffe10)))),
                                 in_stack_fffffffffffffe0c);
              if (bVar2) {
                ImBitArray<130>::ClearBit
                          ((ImBitArray<130> *)
                           CONCAT17(in_stack_fffffffffffffe17,
                                    CONCAT16(in_stack_fffffffffffffe16,
                                             CONCAT15(in_stack_fffffffffffffe15,
                                                      CONCAT14(in_stack_fffffffffffffe14,
                                                               in_stack_fffffffffffffe10)))),
                           in_stack_fffffffffffffe0c);
                local_150 = (float)((int)local_150 + -1);
                local_178 = ImVector<ImDrawChannel>::operator[]
                                      ((ImVector<ImDrawChannel> *)
                                       CONCAT17(in_stack_fffffffffffffe17,
                                                CONCAT16(in_stack_fffffffffffffe16,
                                                         CONCAT15(in_stack_fffffffffffffe15,
                                                                  CONCAT14(in_stack_fffffffffffffe14
                                                                           ,
                                                  in_stack_fffffffffffffe10)))),
                                       in_stack_fffffffffffffe0c);
                in_stack_fffffffffffffe16 = false;
                if ((local_178->_CmdBuffer).Size == 1) {
                  ImVector<ImDrawCmd>::operator[]
                            ((ImVector<ImDrawCmd> *)
                             CONCAT17(in_stack_fffffffffffffe17,
                                      (uint7)CONCAT15(in_stack_fffffffffffffe15,
                                                      CONCAT14(in_stack_fffffffffffffe14,
                                                               in_stack_fffffffffffffe10))),
                             in_stack_fffffffffffffe0c);
                  ImRect::ImRect((ImRect *)
                                 CONCAT17(in_stack_fffffffffffffe17,
                                          CONCAT16(in_stack_fffffffffffffe16,
                                                   CONCAT15(in_stack_fffffffffffffe15,
                                                            CONCAT14(in_stack_fffffffffffffe14,
                                                                     in_stack_fffffffffffffe10)))),
                                 (ImVec4 *)
                                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
                  in_stack_fffffffffffffe16 = ImRect::Contains(&local_168,&local_188);
                }
                if (((in_stack_fffffffffffffe16 ^ 0xff) & 1) != 0) {
                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                              ,0x245b,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                              "channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                             );
                }
                IVar11 = ImRect::ToVec4((ImRect *)0x2d6cd9);
                pIVar9 = ImVector<ImDrawCmd>::operator[]
                                   ((ImVector<ImDrawCmd> *)
                                    CONCAT17(in_stack_fffffffffffffe17,
                                             CONCAT16(in_stack_fffffffffffffe16,
                                                      CONCAT15(in_stack_fffffffffffffe15,
                                                               CONCAT14(in_stack_fffffffffffffe14,
                                                                        in_stack_fffffffffffffe10)))
                                            ),in_stack_fffffffffffffe0c);
                local_198 = IVar11._0_8_;
                (pIVar9->ClipRect).x = (float)(undefined4)local_198;
                (pIVar9->ClipRect).y = (float)local_198._4_4_;
                local_190 = IVar11._8_8_;
                (pIVar9->ClipRect).z = (float)(undefined4)local_190;
                (pIVar9->ClipRect).w = (float)local_190._4_4_;
                iVar4 = (local_178->_CmdBuffer).Capacity;
                (local_130->_CmdBuffer).Size = (local_178->_CmdBuffer).Size;
                (local_130->_CmdBuffer).Capacity = iVar4;
                (local_130->_CmdBuffer).Data = (local_178->_CmdBuffer).Data;
                iVar4 = (local_178->_IdxBuffer).Capacity;
                (local_130->_IdxBuffer).Size = (local_178->_IdxBuffer).Size;
                (local_130->_IdxBuffer).Capacity = iVar4;
                (local_130->_IdxBuffer).Data = (local_178->_IdxBuffer).Data;
                local_130 = local_130 + 1;
              }
            }
          }
        }
        for (local_19c = 0; bVar2 = local_19c < *(int *)(local_18 + 4),
            uVar12 = bVar2 && local_148 != 0, bVar2 && local_148 != 0; local_19c = local_19c + 1) {
          bVar2 = ImBitArray<130>::TestBit
                            ((ImBitArray<130> *)
                             CONCAT17(in_stack_fffffffffffffe17,
                                      CONCAT16(in_stack_fffffffffffffe16,
                                               CONCAT15(uVar12,CONCAT14(in_stack_fffffffffffffe14,
                                                                        in_stack_fffffffffffffe10)))
                                     ),in_stack_fffffffffffffe0c);
          if (bVar2) {
            pIVar8 = ImVector<ImDrawChannel>::operator[]
                               ((ImVector<ImDrawChannel> *)
                                CONCAT17(in_stack_fffffffffffffe17,
                                         CONCAT16(in_stack_fffffffffffffe16,
                                                  CONCAT15(uVar12,CONCAT14(in_stack_fffffffffffffe14
                                                                           ,
                                                  in_stack_fffffffffffffe10)))),
                                in_stack_fffffffffffffe0c);
            iVar4 = (pIVar8->_CmdBuffer).Capacity;
            (local_130->_CmdBuffer).Size = (pIVar8->_CmdBuffer).Size;
            (local_130->_CmdBuffer).Capacity = iVar4;
            (local_130->_CmdBuffer).Data = (pIVar8->_CmdBuffer).Data;
            iVar4 = (pIVar8->_IdxBuffer).Capacity;
            (local_130->_IdxBuffer).Size = (pIVar8->_IdxBuffer).Size;
            (local_130->_IdxBuffer).Capacity = iVar4;
            (local_130->_IdxBuffer).Data = (pIVar8->_IdxBuffer).Data;
            local_148 = local_148 + -1;
            local_130 = local_130 + 1;
          }
        }
        if (local_130 !=
            (local_10->DrawChannelsTempMergeBuffer).Data +
            (local_10->DrawChannelsTempMergeBuffer).Size) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x246a,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                      "dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                     );
        }
        memcpy((void *)(*(long *)(local_18 + 0x10) + 0x20),
               (local_10->DrawChannelsTempMergeBuffer).Data,(long)(*(int *)(local_18 + 4) + -1) << 5
              );
      }
      return;
    }
    if ((*(ulong *)(local_8 + 0x58) & 1L << ((byte)local_d0 & 0x3f)) != 0) {
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)
                          CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                          (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      iVar4 = 1;
      if ((IStack_28.Max.y._3_1_ & 1) != 0) {
        iVar4 = 2;
      }
      for (iVar14 = 0; iVar14 < iVar4; iVar14 = iVar14 + 1) {
        if (iVar14 == 0) {
          local_1c1 = pIVar7->DrawChannelRowsBeforeFreeze;
        }
        else {
          local_1c1 = pIVar7->DrawChannelRowsAfterFreeze;
        }
        iVar5 = (int)local_1c1;
        pIVar8 = ImVector<ImDrawChannel>::operator[]
                           ((ImVector<ImDrawChannel> *)
                            CONCAT17(in_stack_fffffffffffffe17,
                                     CONCAT16(in_stack_fffffffffffffe16,
                                              CONCAT15(in_stack_fffffffffffffe15,
                                                       CONCAT14(in_stack_fffffffffffffe14,
                                                                in_stack_fffffffffffffe10)))),
                            in_stack_fffffffffffffe0c);
        if ((0 < (pIVar8->_CmdBuffer).Size) &&
           (pIVar9 = ImVector<ImDrawCmd>::back
                               ((ImVector<ImDrawCmd> *)
                                CONCAT17(in_stack_fffffffffffffe17,
                                         CONCAT16(in_stack_fffffffffffffe16,
                                                  CONCAT15(in_stack_fffffffffffffe15,
                                                           CONCAT14(in_stack_fffffffffffffe14,
                                                                    in_stack_fffffffffffffe10))))),
           pIVar9->ElemCount == 0)) {
          ImVector<ImDrawCmd>::pop_back
                    ((ImVector<ImDrawCmd> *)
                     CONCAT17(in_stack_fffffffffffffe17,
                              CONCAT16(in_stack_fffffffffffffe16,
                                       CONCAT15(in_stack_fffffffffffffe15,
                                                CONCAT14(in_stack_fffffffffffffe14,
                                                         in_stack_fffffffffffffe10)))));
        }
        if ((pIVar8->_CmdBuffer).Size == 1) {
          if ((pIVar7->Flags & 0x40U) == 0) {
            if (iVar4 == 1) {
              sVar3 = ImMax<short>(pIVar7->ContentWidthRowsUnfrozen,pIVar7->ContentWidthHeadersUsed)
              ;
            }
            else if (iVar14 == 0) {
              sVar3 = ImMax<short>(pIVar7->ContentWidthRowsFrozen,pIVar7->ContentWidthHeadersUsed);
            }
            else {
              sVar3 = pIVar7->ContentWidthRowsUnfrozen;
            }
            if (pIVar7->WidthGiven <= (float)(int)sVar3 && (float)(int)sVar3 != pIVar7->WidthGiven)
            goto LAB_002d6915;
          }
          bVar2 = false;
          if ((IStack_28.Max.y._2_1_ & 1) != 0) {
            bVar2 = local_d0 < *(char *)(local_8 + 0x1d0);
          }
          iVar6 = 2;
          if (bVar2) {
            iVar6 = 0;
          }
          local_1cc = iVar14;
          if ((IStack_28.Max.y._3_1_ & 1) == 0) {
            local_1cc = 1;
          }
          iVar6 = iVar6 + local_1cc;
          if (0x81 < iVar5) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                        ,0x2405,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                        "channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS");
          }
          local_100 = (ImRect *)((long)&local_c8 + (long)iVar6 * 0x28);
          if (aIStack_b8[(long)iVar6 * 5].x == 0.0) {
            ImRect::ImRect((ImRect *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                           (float)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                           (float)in_stack_fffffffffffffe18,
                           (float)CONCAT13(in_stack_fffffffffffffe17,
                                           CONCAT12(in_stack_fffffffffffffe16,
                                                    CONCAT11(in_stack_fffffffffffffe15,
                                                             in_stack_fffffffffffffe14))),
                           in_stack_fffffffffffffe10);
            local_100->Min = local_110;
            local_100->Max = local_108;
          }
          bVar13 = (byte)iVar6;
          ImBitArray<130>::SetBit
                    ((ImBitArray<130> *)
                     CONCAT17(in_stack_fffffffffffffe17,
                              CONCAT16(in_stack_fffffffffffffe16,
                                       CONCAT15(in_stack_fffffffffffffe15,
                                                CONCAT14(in_stack_fffffffffffffe14,
                                                         in_stack_fffffffffffffe10)))),
                     in_stack_fffffffffffffe0c);
          pIVar10 = local_100;
          local_100[1].Min.x = (float)((int)local_100[1].Min.x + 1);
          ImVector<ImDrawCmd>::operator[]
                    ((ImVector<ImDrawCmd> *)
                     CONCAT17(in_stack_fffffffffffffe17,
                              CONCAT16(in_stack_fffffffffffffe16,
                                       CONCAT15(in_stack_fffffffffffffe15,
                                                CONCAT14(in_stack_fffffffffffffe14,
                                                         in_stack_fffffffffffffe10)))),
                     in_stack_fffffffffffffe0c);
          ImRect::ImRect((ImRect *)
                         CONCAT17(in_stack_fffffffffffffe17,
                                  CONCAT16(in_stack_fffffffffffffe16,
                                           CONCAT15(in_stack_fffffffffffffe15,
                                                    CONCAT14(in_stack_fffffffffffffe14,
                                                             in_stack_fffffffffffffe10)))),
                         (ImVec4 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          ImRect::Add(pIVar10,&local_120);
          IStack_28.Max.x = (float)(1 << (bVar13 & 0x1f) | (uint)IStack_28.Max.x);
        }
LAB_002d6915:
      }
      pIVar7->DrawChannelCurrent = -1;
    }
    local_d0 = local_d0 + 1;
  } while( true );
}

Assistant:

void    ImGui::TableReorderDrawChannelsForMerge(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool is_frozen_v = (table->FreezeRowsCount > 0);
    const bool is_frozen_h = (table->FreezeColumnsCount > 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));
    bool merge_groups_all_fit_within_inner_rect = (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0;

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = is_frozen_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelRowsBeforeFreeze : column->DrawChannelRowsAfterFreeze;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column.
            if (!(column->Flags & ImGuiTableColumnFlags_NoClipX))
            {
                float width_contents;
                if (merge_group_sub_count == 1)     // No row freeze (same as testing !is_frozen_v)
                    width_contents = ImMax(column->ContentWidthRowsUnfrozen, column->ContentWidthHeadersUsed);
                else if (merge_group_sub_n == 0)    // Row freeze: use width before freeze
                    width_contents = ImMax(column->ContentWidthRowsFrozen, column->ContentWidthHeadersUsed);
                else                                // Row freeze: use width after freeze
                    width_contents = column->ContentWidthRowsUnfrozen;
                if (width_contents > column->WidthGiven)
                    continue;
            }

            const int merge_group_dst_n = (is_frozen_h && column_n < table->FreezeColumnsCount ? 0 : 2) + (is_frozen_v ? merge_group_sub_n : 1);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_dst_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_dst_n);

            // If we end with a single group and hosted by the outer window, we'll attempt to merge our draw command
            // with the existing outer window command. But we can only do so if our columns all fit within the expected
            // clip rect, otherwise clipping will be incorrect when ScrollX is disabled.
            // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column don't fit within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect

            // 2019/10/22: (1) This is breaking table_2_draw_calls but I cannot seem to repro what it is attempting to
            // fix... cf git fce2e8dc "Fixed issue with clipping when outerwindow==innerwindow / support ScrollH without ScrollV."
            // 2019/10/22: (2) Clamping code in TableUpdateLayout() seemingly made this not necessary...
#if 0
            if (column->MinX < table->InnerClipRect.Min.x || column->MaxX > table->InnerClipRect.Max.x)
                merge_groups_all_fit_within_inner_rect = false;
#endif
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelBeforeRowFreeze/DrawChannelAfterRowFreeze solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = -1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // Conceptually we want to test if only 1 bit of merge_group_mask is set, but with no freezing we know it's always going to be group 3.
        // We need to test for !is_frozen because any unfitting column will not be part of a merge group, so testing for merge_group_mask isn't enough.
        const bool may_extend_clip_rect_to_host_rect = (merge_group_mask == (1 << 3)) && !is_frozen_v && !is_frozen_h;

        // Use shared temporary storage so the allocation gets amortized
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - 1);
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask; // We need 130-bit of storage
        remaining_mask.ClearBits();
        remaining_mask.SetBitRange(1, splitter->_Count - 1); // Background channel 0 not part of the merge (see channel allocation in TableUpdateDrawChannels)
        int remaining_count = splitter->_Count - 1;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_groups[merge_group_n].ClipRect;
                if (may_extend_clip_rect_to_host_rect)
                {
                    IM_ASSERT(merge_group_n == 3);
                    //GetOverlayDrawList()->AddRect(table->HostClipRect.Min, table->HostClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 3.0f);
                    //GetOverlayDrawList()->AddRect(table->InnerClipRect.Min, table->InnerClipRect.Max, IM_COL32(0, 255, 0, 200), 0.0f, ~0, 1.0f);
                    //GetOverlayDrawList()->AddRect(merge_clip_rect.Min, merge_clip_rect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 2.0f);
                    merge_clip_rect.Add(merge_groups_all_fit_within_inner_rect ? table->HostClipRect : table->InnerClipRect);
                    //GetOverlayDrawList()->AddRect(merge_clip_rect.Min, merge_clip_rect.Max, IM_COL32(0, 255, 0, 200));
                }
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + 1, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - 1) * sizeof(ImDrawChannel));
    }
}